

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

void __thiscall
kratos::UniqueGeneratorVisitor::visit(UniqueGeneratorVisitor *this,Generator *generator)

{
  iterator iVar1;
  Generator *local_20;
  Generator *generator_local;
  
  local_20 = generator;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>
          ::find(&(this->generator_map_)._M_t,&generator->name);
  if ((((_Rb_tree_header *)iVar1._M_node ==
        &(this->generator_map_)._M_t._M_impl.super__Rb_tree_header) &&
      ((local_20->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (local_20->lib_files_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && ((local_20->is_external_ & 1U) == 0)) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Generator*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Generator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Generator*>>>
    ::_M_emplace_unique<std::__cxx11::string&,kratos::Generator*&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Generator*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Generator*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Generator*>>>
                *)&this->generator_map_,&local_20->name,&local_20);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        if (generator_map_.find(generator->name) != generator_map_.end()) {
            return;
        }
        // a unique one
        if (!generator->external()) generator_map_.emplace(generator->name, generator);
    }